

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
fmt::v11::detail::buffer<wchar_t>::append<wchar_t>
          (buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  wchar_t *pwVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (begin != end) {
    do {
      uVar5 = (long)end - (long)begin >> 2;
      if ((long)uVar5 < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
                    ,0x1b6,"negative value");
      }
      sVar2 = this->size_;
      uVar3 = this->capacity_;
      if (uVar3 < sVar2 + uVar5) {
        (*this->grow_)(this,sVar2 + uVar5);
        sVar2 = this->size_;
        uVar3 = this->capacity_;
      }
      uVar4 = uVar3 - sVar2;
      if (uVar5 <= uVar3 - sVar2) {
        uVar4 = uVar5;
      }
      if (uVar4 != 0) {
        pwVar1 = this->ptr_;
        uVar5 = 0;
        do {
          pwVar1[sVar2 + uVar5] = begin[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      this->size_ = sVar2 + uVar4;
      begin = begin + uVar4;
    } while (begin != end);
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }